

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

PTR brynet::net::AsyncConnector::Create(void)

{
  _Impl *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  PTR PVar3;
  __allocator_type __a2;
  allocator<std::_Sp_counted_ptr_inplace<make_shared_enabler,_std::allocator<make_shared_enabler>,_(__gnu_cxx::_Lock_policy)2>_>
  local_49;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<make_shared_enabler,_std::allocator<make_shared_enabler>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_48;
  _Impl *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  p_Var2 = (pointer)operator_new(0xa0);
  local_48._M_alloc = &local_49;
  (((enable_shared_from_this<brynet::net::AsyncConnector> *)
   &(p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count)->_M_weak_this).
  super___weak_ptr<brynet::net::AsyncConnector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00155000;
  this = &p_Var2->_M_impl;
  local_48._M_ptr = p_Var2;
  memset(this,0,0x90);
  AsyncConnector((AsyncConnector *)this);
  local_48._M_ptr = (pointer)0x0;
  (p_Var2->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__AsyncConnector_00155050;
  local_38 = this;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<make_shared_enabler,_std::allocator<make_shared_enabler>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_48);
  std::__weak_ptr<brynet::net::AsyncConnector,_(__gnu_cxx::_Lock_policy)2>::_M_assign
            ((__weak_ptr<brynet::net::AsyncConnector,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8),(AsyncConnector *)this,a_Stack_30)
  ;
  _Var1._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI->_vptr_AsyncConnector = (_func_int **)local_38;
  (in_RDI->super_enable_shared_from_this<brynet::net::AsyncConnector>)._M_weak_this.
  super___weak_ptr<brynet::net::AsyncConnector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_38 = (_Impl *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  PVar3.super___shared_ptr<brynet::net::AsyncConnector,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar3.super___shared_ptr<brynet::net::AsyncConnector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (PTR)PVar3.super___shared_ptr<brynet::net::AsyncConnector,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AsyncConnector::PTR AsyncConnector::Create()
{
    struct make_shared_enabler : public AsyncConnector {};
    return std::make_shared<make_shared_enabler>();
}